

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestSubNinja::Run(ParserTestSubNinja *this)

{
  State *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  StringPiece path;
  StringPiece path_00;
  string local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test.ninja","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"var = inner\nbuild $builddir/inner: varref\n","");
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  iVar4 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "builddir = some_dir/\nrule varref\n  command = varref $var\nvar = outer\nbuild $builddir/outer: varref\nsubninja test.ninja\nbuild $builddir/outer2: varref\n"
            );
  if (iVar4 == g_current_test->assertion_failures_) {
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_ParserTest).fs_.files_read_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_ParserTest).fs_.files_read_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x371,"1u == fs_.files_read_.size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(this->super_ParserTest).fs_.files_read_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar2,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x373,"\"test.ninja\" == fs_.files_read_[0]");
      pTVar2 = g_current_test;
      this_00 = &(this->super_ParserTest).state;
      path.len_ = 0xe;
      path.str_ = "some_dir/outer";
      pNVar5 = State::LookupNode(this_00,path);
      testing::Test::Check
                (pTVar2,pNVar5 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x374,"state.LookupNode(\"some_dir/outer\")");
      pTVar2 = g_current_test;
      path_00.len_ = 0xe;
      path_00.str_ = "some_dir/inner";
      pNVar5 = State::LookupNode(this_00,path_00);
      testing::Test::Check
                (pTVar2,pNVar5 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x376,"state.LookupNode(\"some_dir/inner\")");
      bVar3 = testing::Test::Check
                        (g_current_test,
                         (long)(this->super_ParserTest).state.edges_.
                               super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(this->super_ParserTest).state.edges_.
                               super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                               super__Vector_impl_data._M_start == 0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                         ,0x378,"3u == state.edges_.size()");
      pTVar2 = g_current_test;
      if (bVar3) {
        Edge::EvaluateCommand_abi_cxx11_
                  (&local_70,
                   *(this->super_ParserTest).state.edges_.
                    super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,false);
        iVar4 = std::__cxx11::string::compare((char *)&local_70);
        testing::Test::Check
                  (pTVar2,iVar4 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x379,"\"varref outer\" == state.edges_[0]->EvaluateCommand()");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pTVar2 = g_current_test;
        Edge::EvaluateCommand_abi_cxx11_
                  (&local_70,
                   (this->super_ParserTest).state.edges_.
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start[1],false);
        iVar4 = std::__cxx11::string::compare((char *)&local_70);
        testing::Test::Check
                  (pTVar2,iVar4 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x37a,"\"varref inner\" == state.edges_[1]->EvaluateCommand()");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pTVar2 = g_current_test;
        Edge::EvaluateCommand_abi_cxx11_
                  (&local_70,
                   (this->super_ParserTest).state.edges_.
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start[2],false);
        iVar4 = std::__cxx11::string::compare((char *)&local_70);
        testing::Test::Check
                  (pTVar2,iVar4 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                   ,0x37b,"\"varref outer\" == state.edges_[2]->EvaluateCommand()");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, SubNinja) {
  fs_.Create("test.ninja",
    "var = inner\n"
    "build $builddir/inner: varref\n");
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"builddir = some_dir/\n"
"rule varref\n"
"  command = varref $var\n"
"var = outer\n"
"build $builddir/outer: varref\n"
"subninja test.ninja\n"
"build $builddir/outer2: varref\n"));
  ASSERT_EQ(1u, fs_.files_read_.size());

  EXPECT_EQ("test.ninja", fs_.files_read_[0]);
  EXPECT_TRUE(state.LookupNode("some_dir/outer"));
  // Verify our builddir setting is inherited.
  EXPECT_TRUE(state.LookupNode("some_dir/inner"));

  ASSERT_EQ(3u, state.edges_.size());
  EXPECT_EQ("varref outer", state.edges_[0]->EvaluateCommand());
  EXPECT_EQ("varref inner", state.edges_[1]->EvaluateCommand());
  EXPECT_EQ("varref outer", state.edges_[2]->EvaluateCommand());
}